

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# properties.h
# Opt level: O2

double __thiscall libDAI::Properties::GetAs<double>(Properties *this,PropertyKey *key)

{
  const_iterator cVar1;
  double dVar2;
  
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
                  *)this,key);
  dVar2 = boost::any_cast<double>((any *)(cVar1._M_node + 2));
  return dVar2;
}

Assistant:

ValueType GetAs(const PropertyKey &key) const {
                try {
                    return boost::any_cast<ValueType>(Get(key));
                } catch( const boost::bad_any_cast & ) {
                    std::cerr << "Cannot cast property " << key << " to ";
                    std::cerr << typeid(ValueType).name() << std::endl;
                    return boost::any_cast<ValueType>(Get(key));
                }
            }